

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

void __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits>::
get_match_positions_greedy<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (Matcher<cpsm::PlatformPathTraits,cpsm::SimpleStringTraits> *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *posns,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_first,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> item_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_it,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> query_last)

{
  char *pcVar1;
  unsigned_long uVar2;
  unsigned_long local_38;
  
  pcVar1 = *(char **)(this + 0x10);
  uVar2 = (long)item_it._M_current - (long)item_first._M_current;
  while ((item_it._M_current != pcVar1 && (query_it._M_current != query_last._M_current))) {
    if (*item_it._M_current == *query_it._M_current) {
      query_it._M_current = query_it._M_current + 1;
      local_38 = uVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (posns,&local_38);
    }
    item_it._M_current = item_it._M_current + 1;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void get_match_positions_greedy(std::vector<std::size_t>& posns,
                                  InputIt1 const item_first, InputIt1 item_it,
                                  InputIt2 query_it,
                                  InputIt2 const query_last) const {
    auto const item_last = item_.cend();
    while (item_it != item_last && query_it != query_last) {
      if (*item_it == *query_it) {
        ++query_it;
        posns.push_back(item_it - item_first);
      }
      ++item_it;
    }
  }